

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O2

int RSA_padding_check_PKCS1_OAEP_mgf1
              (uint8_t *out,size_t *out_len,size_t max_out,uint8_t *from,size_t from_len,
              uint8_t *param,size_t param_len,EVP_MD *md,EVP_MD *mgf1md)

{
  int iVar1;
  size_t i;
  undefined4 extraout_var;
  uchar *mask;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t i_2;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int line;
  ulong size;
  uint8_t seed [64];
  uint8_t phash [64];
  
  if (md == (EVP_MD *)0x0) {
    md = (EVP_MD *)EVP_sha1();
  }
  if (mgf1md == (EVP_MD *)0x0) {
    mgf1md = md;
  }
  iVar1 = EVP_MD_size((EVP_MD *)md);
  uVar5 = CONCAT44(extraout_var,iVar1);
  if (from_len < uVar5 * 2 + 2) {
    mask = (uchar *)0x0;
LAB_001ad3f5:
    iVar1 = 0x85;
    line = 0xd6;
  }
  else {
    size = ~uVar5 + from_len;
    mask = (uchar *)OPENSSL_malloc(size);
    if (mask == (uchar *)0x0) {
      mask = (uchar *)0x0;
      goto LAB_001ad49e;
    }
    iVar1 = PKCS1_MGF1(seed,uVar5,from + uVar5 + 1,size,(EVP_MD *)mgf1md);
    if (iVar1 == 0) goto LAB_001ad49e;
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      seed[uVar2] = seed[uVar2] ^ from[uVar2 + 1];
    }
    iVar1 = PKCS1_MGF1(mask,size,seed,uVar5,(EVP_MD *)mgf1md);
    if (iVar1 == 0) goto LAB_001ad49e;
    for (uVar2 = 0; size != uVar2; uVar2 = uVar2 + 1) {
      mask[uVar2] = mask[uVar2] ^ (from + uVar5 + 1)[uVar2];
    }
    iVar1 = EVP_Digest(param,param_len,phash,(uint *)0x0,(EVP_MD *)md,(ENGINE *)0x0);
    if (iVar1 == 0) goto LAB_001ad49e;
    iVar1 = CRYPTO_memcmp(mask,phash,uVar5);
    uVar4 = (long)(-(long)iVar1 | (long)iVar1 | -(ulong)*from) >> 0x3f;
    uVar2 = 0xffffffffffffffff;
    uVar3 = 0;
    for (; uVar5 < size; uVar5 = uVar5 + 1) {
      uVar6 = (ulong)mask[uVar5];
      uVar7 = (long)((uVar6 ^ 1) - 1) >> 0x3f;
      uVar3 = uVar3 ^ (uVar5 ^ uVar3) & uVar7 & uVar2;
      uVar2 = uVar2 & ~uVar7;
      if (uVar6 != 0) {
        uVar6 = uVar2;
      }
      uVar4 = uVar4 | uVar6;
    }
    if (uVar2 != 0 || uVar4 != 0) goto LAB_001ad3f5;
    uVar3 = uVar3 + 1;
    uVar5 = size - uVar3;
    if (uVar5 <= max_out) {
      if (size != uVar3) {
        memcpy(out,mask + uVar3,uVar5);
      }
      *out_len = uVar5;
      OPENSSL_free(mask);
      return 1;
    }
    iVar1 = 0x71;
    line = 0xc9;
  }
  ERR_put_error(4,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                ,line);
LAB_001ad49e:
  OPENSSL_free(mask);
  return 0;
}

Assistant:

int RSA_padding_check_PKCS1_OAEP_mgf1(uint8_t *out, size_t *out_len,
                                      size_t max_out, const uint8_t *from,
                                      size_t from_len, const uint8_t *param,
                                      size_t param_len, const EVP_MD *md,
                                      const EVP_MD *mgf1md) {
  uint8_t *db = NULL;

  {
    if (md == NULL) {
      md = EVP_sha1();
    }
    if (mgf1md == NULL) {
      mgf1md = md;
    }

    size_t mdlen = EVP_MD_size(md);

    // The encoded message is one byte smaller than the modulus to ensure that
    // it doesn't end up greater than the modulus. Thus there's an extra "+1"
    // here compared to https://tools.ietf.org/html/rfc2437#section-9.1.1.2.
    if (from_len < 1 + 2 * mdlen + 1) {
      // 'from_len' is the length of the modulus, i.e. does not depend on the
      // particular ciphertext.
      goto decoding_err;
    }

    size_t dblen = from_len - mdlen - 1;
    db = reinterpret_cast<uint8_t *>(OPENSSL_malloc(dblen));
    if (db == NULL) {
      goto err;
    }

    const uint8_t *maskedseed = from + 1;
    const uint8_t *maskeddb = from + 1 + mdlen;

    uint8_t seed[EVP_MAX_MD_SIZE];
    if (!PKCS1_MGF1(seed, mdlen, maskeddb, dblen, mgf1md)) {
      goto err;
    }
    for (size_t i = 0; i < mdlen; i++) {
      seed[i] ^= maskedseed[i];
    }

    if (!PKCS1_MGF1(db, dblen, seed, mdlen, mgf1md)) {
      goto err;
    }
    for (size_t i = 0; i < dblen; i++) {
      db[i] ^= maskeddb[i];
    }

    uint8_t phash[EVP_MAX_MD_SIZE];
    if (!EVP_Digest(param, param_len, phash, NULL, md, NULL)) {
      goto err;
    }

    crypto_word_t bad =
        ~constant_time_is_zero_w(CRYPTO_memcmp(db, phash, mdlen));
    bad |= ~constant_time_is_zero_w(from[0]);

    crypto_word_t looking_for_one_byte = CONSTTIME_TRUE_W;
    size_t one_index = 0;
    for (size_t i = mdlen; i < dblen; i++) {
      crypto_word_t equals1 = constant_time_eq_w(db[i], 1);
      crypto_word_t equals0 = constant_time_eq_w(db[i], 0);
      one_index =
          constant_time_select_w(looking_for_one_byte & equals1, i, one_index);
      looking_for_one_byte =
          constant_time_select_w(equals1, 0, looking_for_one_byte);
      bad |= looking_for_one_byte & ~equals0;
    }

    bad |= looking_for_one_byte;

    // Whether the overall padding was valid or not in OAEP is public.
    if (constant_time_declassify_w(bad)) {
      goto decoding_err;
    }

    // Once the padding is known to be valid, the output length is also public.
    static_assert(sizeof(size_t) <= sizeof(crypto_word_t),
                  "size_t does not fit in crypto_word_t");
    one_index = constant_time_declassify_w(one_index);

    one_index++;
    size_t mlen = dblen - one_index;
    if (max_out < mlen) {
      OPENSSL_PUT_ERROR(RSA, RSA_R_DATA_TOO_LARGE);
      goto err;
    }

    OPENSSL_memcpy(out, db + one_index, mlen);
    *out_len = mlen;
    OPENSSL_free(db);
    return 1;
  }

decoding_err:
  // To avoid chosen ciphertext attacks, the error message should not reveal
  // which kind of decoding error happened.
  OPENSSL_PUT_ERROR(RSA, RSA_R_OAEP_DECODING_ERROR);
err:
  OPENSSL_free(db);
  return 0;
}